

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O0

void __thiscall
Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_4,_false>::gemm_blocking_space
          (gemm_blocking_space<0,_double,_double,__1,__1,__1,_4,_false> *this,Index rows,Index cols,
          Index depth,Index num_threads,bool l3_blocking)

{
  Index local_40;
  Index n;
  Index IStack_30;
  bool l3_blocking_local;
  Index num_threads_local;
  Index depth_local;
  Index cols_local;
  Index rows_local;
  gemm_blocking_space<0,_double,_double,__1,__1,__1,_4,_false> *this_local;
  
  n._7_1_ = l3_blocking;
  IStack_30 = num_threads;
  num_threads_local = depth;
  depth_local = cols;
  cols_local = rows;
  rows_local = (Index)this;
  level3_blocking<double,_double>::level3_blocking(&this->super_level3_blocking<double,_double>);
  (this->super_level3_blocking<double,_double>).m_mc = cols_local;
  (this->super_level3_blocking<double,_double>).m_nc = depth_local;
  (this->super_level3_blocking<double,_double>).m_kc = num_threads_local;
  if ((n._7_1_ & 1) == 0) {
    local_40 = (this->super_level3_blocking<double,_double>).m_nc;
    computeProductBlockingSizes<double,double,4,long>
              (&(this->super_level3_blocking<double,_double>).m_kc,
               &(this->super_level3_blocking<double,_double>).m_mc,&local_40,IStack_30);
  }
  else {
    computeProductBlockingSizes<double,double,4,long>
              (&(this->super_level3_blocking<double,_double>).m_kc,
               &(this->super_level3_blocking<double,_double>).m_mc,
               &(this->super_level3_blocking<double,_double>).m_nc,IStack_30);
  }
  this->m_sizeA =
       (this->super_level3_blocking<double,_double>).m_mc *
       (this->super_level3_blocking<double,_double>).m_kc;
  this->m_sizeB =
       (this->super_level3_blocking<double,_double>).m_kc *
       (this->super_level3_blocking<double,_double>).m_nc;
  return;
}

Assistant:

gemm_blocking_space(Index rows, Index cols, Index depth, Index num_threads, bool l3_blocking)
    {
      this->m_mc = Transpose ? cols : rows;
      this->m_nc = Transpose ? rows : cols;
      this->m_kc = depth;

      if(l3_blocking)
      {
        computeProductBlockingSizes<LhsScalar,RhsScalar,KcFactor>(this->m_kc, this->m_mc, this->m_nc, num_threads);
      }
      else  // no l3 blocking
      {
        Index n = this->m_nc;
        computeProductBlockingSizes<LhsScalar,RhsScalar,KcFactor>(this->m_kc, this->m_mc, n, num_threads);
      }

      m_sizeA = this->m_mc * this->m_kc;
      m_sizeB = this->m_kc * this->m_nc;
    }